

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZoneNamesImpl::loadStrings
          (TimeZoneNamesImpl *this,UnicodeString *tzCanonicalID,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  UnicodeString *mzID;
  long *plVar2;
  
  loadTimeZoneNames(this,tzCanonicalID,status);
  iVar1 = (*(this->super_TimeZoneNames).super_UObject._vptr_UObject[6])(this,tzCanonicalID,status);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    while( true ) {
      mzID = (UnicodeString *)(**(code **)(*plVar2 + 0x38))(plVar2,status);
      if ((mzID == (UnicodeString *)0x0) || (U_ZERO_ERROR < *status)) break;
      loadMetaZoneNames(this,mzID,status);
    }
  }
  else if (plVar2 == (long *)0x0) {
    return;
  }
  (**(code **)(*plVar2 + 8))(plVar2);
  return;
}

Assistant:

void
TimeZoneNamesImpl::loadStrings(const UnicodeString& tzCanonicalID, UErrorCode& status) {
    loadTimeZoneNames(tzCanonicalID, status);
    LocalPointer<StringEnumeration> mzIDs(getAvailableMetaZoneIDs(tzCanonicalID, status));
    if (U_FAILURE(status)) { return; }
    U_ASSERT(!mzIDs.isNull());

    const UnicodeString *mzID;
    while (((mzID = mzIDs->snext(status)) != NULL) && U_SUCCESS(status)) {
        loadMetaZoneNames(*mzID, status);
    }
}